

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O0

mz_bool mz_zip_reader_is_file_encrypted(mz_zip_archive *pZip,mz_uint file_index)

{
  mz_uint8 *p;
  mz_uint m_bit_flag;
  mz_uint file_index_local;
  mz_zip_archive *pZip_local;
  long local_10;
  
  if ((((pZip == (mz_zip_archive *)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0)) ||
      (pZip->m_total_files <= file_index)) || (pZip->m_zip_mode != MZ_ZIP_MODE_READING)) {
    local_10 = 0;
  }
  else {
    local_10 = (long)(pZip->m_pState->m_central_dir).m_p +
               (ulong)*(uint *)((long)(pZip->m_pState->m_central_dir_offsets).m_p +
                               (ulong)file_index * 4);
  }
  if (local_10 == 0) {
    pZip_local._0_4_ = 0;
  }
  else {
    pZip_local._0_4_ = *(ushort *)(local_10 + 8) & 1;
  }
  return (uint)pZip_local;
}

Assistant:

mz_bool mz_zip_reader_is_file_encrypted(mz_zip_archive *pZip, mz_uint file_index)
{
  mz_uint m_bit_flag;
  const mz_uint8 *p = mz_zip_reader_get_cdh(pZip, file_index);
  if (!p)
    return MZ_FALSE;
  m_bit_flag = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
  return (m_bit_flag & 1);
}